

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefile.cpp
# Opt level: O3

ProStringList * __thiscall
MakefileGenerator::findFilesInVPATH
          (ProStringList *__return_storage_ptr__,MakefileGenerator *this,ProStringList l,uchar flags
          ,QString *vpath_var)

{
  Data *pDVar1;
  ProString *pPVar2;
  QString string;
  QString file;
  QString string_00;
  QString file_00;
  QString file_01;
  Data *pDVar3;
  char16_t *pcVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  byte bVar9;
  char cVar10;
  byte bVar11;
  bool bVar12;
  longlong __old_val;
  _List_node_base *this_00;
  pointer pPVar13;
  iterator this_01;
  iterator iVar14;
  long lVar15;
  pointer pQVar16;
  uint uVar17;
  undefined7 in_register_00000011;
  QList<ProString> *this_02;
  QMakeProject *pQVar18;
  qsizetype i;
  QString *in_R8;
  QMakeProject *pQVar19;
  QMakeProject *pQVar20;
  ulong uVar21;
  QMakeProject *pQVar22;
  ulong uVar23;
  ulong uVar24;
  int idx;
  long in_FS_OFFSET;
  QStringView QVar25;
  QByteArrayView QVar26;
  QStringView QVar27;
  ProStringList ret;
  ProString dir;
  undefined1 in_stack_fffffffffffffdf8 [15];
  QString local_1b8;
  QString local_1a0;
  QString local_188;
  QString local_170;
  undefined1 local_158 [32];
  undefined1 local_138 [64];
  QString local_f8;
  QArrayDataPointer<ProString> local_d8;
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  QHash<QString,_QList<QString>_> QStack_78;
  QHash<ReplaceExtraCompilerCacheKey,_QString> local_70;
  undefined1 local_68 [32];
  char *local_48;
  undefined1 *puStack_40;
  Data *local_38;
  
  this_02 = (QList<ProString> *)CONCAT71(in_register_00000011,flags);
  local_38 = *(Data **)(in_FS_OFFSET + 0x28);
  local_d8.d = (Data *)0x0;
  local_d8.ptr = (ProString *)0x0;
  local_d8.size = 0;
  if ((this_02->d).size == 0) {
    lVar15 = 0;
  }
  else {
    uVar17 = (uint)vpath_var;
    uVar21 = (ulong)vpath_var & 0xffffffff;
    this_00 = (this->project->super_QMakeEvaluator).m_valuemapStack.
              super_list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
              .
              super__List_base<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
              ._M_impl._M_node.super__List_node_base._M_next + 1;
    bVar9 = (byte)(uVar21 >> 1) & 0x7f;
    i = 0;
    idx = 0;
    do {
      pPVar13 = QList<ProString>::data(this_02);
      if (pPVar13[i].m_length == 0) {
LAB_0015a68c:
        idx = idx + 1;
      }
      else {
        pQVar18 = (QMakeProject *)(pPVar13 + i);
        local_f8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_f8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_f8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        ProString::toQString((QString *)(local_138 + 0x40),(ProString *)pQVar18);
        local_138._48_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_138._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_138._40_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_68._0_8_ = local_f8.d.d;
        local_68._8_8_ = local_f8.d.ptr;
        local_68._16_8_ = local_f8.d.size;
        if ((ProString *)local_f8.d.d != (ProString *)0x0) {
          LOCK();
          *(int *)&(((QString *)&(local_f8.d.d)->super_QArrayData)->d).d =
               *(int *)&(((QString *)&(local_f8.d.d)->super_QArrayData)->d).d + 1;
          UNLOCK();
        }
        string.d.ptr._7_1_ = bVar9;
        string.d._0_15_ = in_stack_fffffffffffffdf8;
        string.d.size._0_4_ = uVar17;
        string.d.size._4_4_ = idx;
        Option::fixString((QString *)(local_138 + 0x20),string,(uchar)(ProString *)local_68);
        if ((ProString *)local_68._0_8_ != (ProString *)0x0) {
          LOCK();
          *(int *)&(((QString *)local_68._0_8_)->d).d =
               *(int *)&(((QString *)local_68._0_8_)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)local_68._0_8_)->d).d == 0) {
            QArrayData::deallocate((QArrayData *)local_68._0_8_,2,0x10);
          }
        }
        if ((QMakeProject *)local_138._48_8_ == (QMakeProject *)0x0) {
          idx = idx + 1;
          bVar11 = 0;
          bVar12 = false;
        }
        else {
          if ((uVar21 & 4) == 0) {
            fileFixify((QString *)local_68,this,(QString *)(local_138 + 0x20),(FileFixifyTypes)0x3,
                       true);
            uVar8 = local_68._16_8_;
            uVar7 = local_68._0_8_;
            uVar6 = local_138._40_8_;
            uVar5 = local_138._32_8_;
            local_68._0_8_ = local_138._32_8_;
            local_138._32_8_ = uVar7;
            local_138._40_8_ = local_68._8_8_;
            local_68._8_8_ = uVar6;
            local_68._16_8_ = local_138._48_8_;
            local_138._48_8_ = uVar8;
            if ((ProString *)uVar5 != (ProString *)0x0) {
              LOCK();
              *(int *)&(((QString *)uVar5)->d).d = *(int *)&(((QString *)uVar5)->d).d + -1;
              UNLOCK();
              if (*(int *)&(((QString *)uVar5)->d).d == 0) {
                QArrayData::deallocate((QArrayData *)uVar5,2,0x10);
              }
            }
          }
          uVar5 = local_138._32_8_;
          if ((ProString *)local_138._32_8_ == (ProString *)0x0) {
            local_68._0_8_ = (ProString *)0x0;
          }
          else {
            LOCK();
            *(int *)&(((QString *)local_138._32_8_)->d).d =
                 *(int *)&(((QString *)local_138._32_8_)->d).d + 1;
            UNLOCK();
            local_68._0_8_ = local_138._32_8_;
            LOCK();
            *(int *)&(((QString *)local_138._32_8_)->d).d =
                 *(int *)&(((QString *)local_138._32_8_)->d).d + 1;
            UNLOCK();
          }
          local_68._16_8_ = local_138._48_8_;
          local_68._8_8_ = local_138._40_8_;
          file.d.ptr._7_1_ = bVar9;
          file.d._0_15_ = in_stack_fffffffffffffdf8;
          file.d.size._0_4_ = uVar17;
          file.d.size._4_4_ = idx;
          fileInfo((MakefileGenerator *)local_98,file);
          cVar10 = QFileInfo::exists();
          QFileInfo::~QFileInfo((QFileInfo *)local_98);
          if ((ProString *)local_68._0_8_ != (ProString *)0x0) {
            LOCK();
            *(int *)&(((QString *)local_68._0_8_)->d).d =
                 *(int *)&(((QString *)local_68._0_8_)->d).d + -1;
            UNLOCK();
            if (*(int *)&(((QString *)local_68._0_8_)->d).d == 0) {
              QArrayData::deallocate((QArrayData *)local_68._0_8_,2,0x10);
            }
          }
          if ((ProString *)uVar5 != (ProString *)0x0) {
            LOCK();
            *(int *)&(((QString *)uVar5)->d).d = *(int *)&(((QString *)uVar5)->d).d + -1;
            UNLOCK();
            if (*(int *)&(((QString *)uVar5)->d).d == 0) {
              QArrayData::deallocate((QArrayData *)uVar5,2,0x10);
            }
          }
          if (cVar10 == '\0') {
            cVar10 = QDir::isRelativePath((QString *)(local_138 + 0x40));
            uVar21 = (ulong)uVar17;
            if (cVar10 != '\0') {
              if ((QMakeProject *)local_d8.size == (QMakeProject *)0x0) {
                if ((in_R8->d).size != 0) {
                  ProKey::ProKey((ProKey *)local_68,in_R8);
                  local_98._16_8_ = (ProString *)0x0;
                  local_98._0_8_ = (ProString *)0x0;
                  local_98._8_8_ = (ProString *)0x0;
                  QMap<ProKey,_ProStringList>::value
                            ((ProStringList *)local_b8,(QMap<ProKey,_ProStringList> *)this_00,
                             (ProKey *)local_68,(ProStringList *)local_98);
                  QArrayDataPointer<ProString>::~QArrayDataPointer
                            ((QArrayDataPointer<ProString> *)local_98);
                  uVar7 = local_b8._16_8_;
                  uVar6 = local_b8._8_8_;
                  uVar5 = local_b8._0_8_;
                  local_98._16_8_ = local_d8.size;
                  local_98._8_8_ = local_d8.ptr;
                  local_98._0_8_ = local_d8.d;
                  local_b8._16_8_ = (QMakeProject *)0x0;
                  local_b8._0_8_ = (ProString *)0x0;
                  local_b8._8_8_ = (QMakeProject *)0x0;
                  local_d8.d = (Data *)uVar5;
                  local_d8.ptr = (ProString *)uVar6;
                  local_d8.size = uVar7;
                  QArrayDataPointer<ProString>::~QArrayDataPointer
                            ((QArrayDataPointer<ProString> *)local_98);
                  QArrayDataPointer<ProString>::~QArrayDataPointer
                            ((QArrayDataPointer<ProString> *)local_b8);
                  if ((ProString *)local_68._0_8_ != (ProString *)0x0) {
                    LOCK();
                    *(int *)&(((QString *)local_68._0_8_)->d).d =
                         *(int *)&(((QString *)local_68._0_8_)->d).d + -1;
                    UNLOCK();
                    if (*(int *)&(((QString *)local_68._0_8_)->d).d == 0) {
                      QArrayData::deallocate((QArrayData *)local_68._0_8_,2,0x10);
                    }
                  }
                }
                ProKey::ProKey((ProKey *)local_68,"VPATH");
                local_98._16_8_ = (QMakeProject *)0x0;
                local_98._0_8_ = (ProString *)0x0;
                local_98._8_8_ = (QMakeProject *)0x0;
                QMap<ProKey,_ProStringList>::value
                          ((ProStringList *)local_138,(QMap<ProKey,_ProStringList> *)this_00,
                           (ProKey *)local_68,(ProStringList *)local_98);
                QArrayDataPointer<ProString>::~QArrayDataPointer
                          ((QArrayDataPointer<ProString> *)local_98);
                ProKey::ProKey((ProKey *)local_98,"QMAKE_ABSOLUTE_SOURCE_PATH");
                local_b8._16_8_ = (char16_t *)0x0;
                local_b8._0_8_ = (Data *)0x0;
                local_b8._8_8_ = (ProString *)0x0;
                QMap<ProKey,_ProStringList>::value
                          ((ProStringList *)local_158,(QMap<ProKey,_ProStringList> *)this_00,
                           (ProKey *)local_98,(ProStringList *)local_b8);
                QArrayDataPointer<ProString>::~QArrayDataPointer
                          ((QArrayDataPointer<ProString> *)local_b8);
                local_b8._0_8_ = local_138._0_8_;
                local_b8._8_8_ = local_138._8_8_;
                local_b8._16_8_ = local_138._16_8_;
                if ((ProString *)local_138._0_8_ != (ProString *)0x0) {
                  LOCK();
                  *(int *)&((DataPointer *)local_138._0_8_)->d =
                       *(int *)&((DataPointer *)local_138._0_8_)->d + 1;
                  UNLOCK();
                }
                QtPrivate::QCommonArrayOps<ProString>::growAppend
                          ((QCommonArrayOps<ProString> *)local_b8,(ProString *)local_158._8_8_,
                           (ProString *)
                           ((DataPointer *)&((QMakeEvaluator *)local_158._8_8_)->m_caller +
                           local_158._16_8_ * 2));
                if ((QMakeProject *)local_b8._16_8_ != (QMakeProject *)0x0) {
                  QtPrivate::QCommonArrayOps<ProString>::growAppend
                            ((QCommonArrayOps<ProString> *)(local_138 + 0x60),
                             (ProString *)local_b8._8_8_,
                             (ProString *)
                             ((DataPointer *)&((QMakeEvaluator *)local_b8._8_8_)->m_caller +
                             local_b8._16_8_ * 2));
                }
                QArrayDataPointer<ProString>::~QArrayDataPointer
                          ((QArrayDataPointer<ProString> *)local_b8);
                QArrayDataPointer<ProString>::~QArrayDataPointer
                          ((QArrayDataPointer<ProString> *)local_158);
                if ((ProString *)local_98._0_8_ != (ProString *)0x0) {
                  LOCK();
                  *(int *)&(((QString *)local_98._0_8_)->d).d =
                       *(int *)&(((QString *)local_98._0_8_)->d).d + -1;
                  UNLOCK();
                  if (*(int *)&(((QString *)local_98._0_8_)->d).d == 0) {
                    QArrayData::deallocate((QArrayData *)local_98._0_8_,2,0x10);
                  }
                }
                QArrayDataPointer<ProString>::~QArrayDataPointer
                          ((QArrayDataPointer<ProString> *)local_138);
                if ((ProString *)local_68._0_8_ != (ProString *)0x0) {
                  LOCK();
                  *(int *)&(((QString *)local_68._0_8_)->d).d =
                       *(int *)&(((QString *)local_68._0_8_)->d).d + -1;
                  UNLOCK();
                  if (*(int *)&(((QString *)local_68._0_8_)->d).d == 0) {
                    QArrayData::deallocate((QArrayData *)local_68._0_8_,2,0x10);
                  }
                }
                qmake_getpwd();
                bVar11 = 1;
                if (Option::output_dir.d.size == local_68._16_8_) {
                  QVar25.m_data = Option::output_dir.d.ptr;
                  QVar25.m_size = Option::output_dir.d.size;
                  QVar27.m_data = (storage_type_conflict *)local_68._8_8_;
                  QVar27.m_size = Option::output_dir.d.size;
                  bVar11 = QtPrivate::equalStrings(QVar25,QVar27);
                  bVar11 = bVar11 ^ 1;
                }
                if ((ProString *)local_68._0_8_ != (ProString *)0x0) {
                  LOCK();
                  *(int *)&(((QString *)local_68._0_8_)->d).d =
                       *(int *)&(((QString *)local_68._0_8_)->d).d + -1;
                  UNLOCK();
                  if (*(int *)&(((QString *)local_68._0_8_)->d).d == 0) {
                    QArrayData::deallocate((QArrayData *)local_68._0_8_,2,0x10);
                  }
                }
                uVar21 = (ulong)uVar17;
                if (bVar11 != 0) {
                  ProString::ProString((ProString *)local_68,&Option::output_dir);
                  QtPrivate::QMovableArrayOps<ProString>::emplace<ProString_const&>
                            ((QMovableArrayOps<ProString> *)(local_138 + 0x60),local_d8.size,
                             (ProString *)local_68);
                  QList<ProString>::end((QList<ProString> *)(local_138 + 0x60));
                  if ((ProString *)local_68._0_8_ != (ProString *)0x0) {
                    LOCK();
                    *(int *)&(((QString *)local_68._0_8_)->d).d =
                         *(int *)&(((QString *)local_68._0_8_)->d).d + -1;
                    UNLOCK();
                    if (*(int *)&(((QString *)local_68._0_8_)->d).d == 0) {
                      QArrayData::deallocate((QArrayData *)local_68._0_8_,2,0x10);
                    }
                  }
                }
              }
              this_01 = QList<ProString>::begin((QList<ProString> *)(local_138 + 0x60));
              iVar14 = QList<ProString>::end((QList<ProString> *)(local_138 + 0x60));
              if (this_01.i != iVar14.i) {
                bVar12 = false;
                do {
                  local_b8._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
                  local_b8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
                  local_b8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
                  ProString::toQString((QString *)local_98,this_01.i);
                  local_68._0_8_ = local_98._0_8_;
                  local_68._8_8_ = local_98._8_8_;
                  local_68._16_8_ = local_98._16_8_;
                  if ((ProString *)local_98._0_8_ != (ProString *)0x0) {
                    LOCK();
                    *(int *)&((DataPointer *)local_98._0_8_)->d =
                         *(int *)&((DataPointer *)local_98._0_8_)->d + 1;
                    UNLOCK();
                  }
                  string_00.d.ptr._7_1_ = bVar9;
                  string_00.d._0_15_ = in_stack_fffffffffffffdf8;
                  string_00.d.size._0_4_ = uVar17;
                  string_00.d.size._4_4_ = idx;
                  Option::fixString((QString *)local_b8,string_00,(uchar)local_68);
                  uVar5 = local_68._0_8_;
                  if ((ProString *)local_68._0_8_ != (ProString *)0x0) {
                    LOCK();
                    *(int *)&((DataPointer *)local_68._0_8_)->d =
                         *(int *)&((DataPointer *)local_68._0_8_)->d + -1;
                    UNLOCK();
                    if (*(int *)&((DataPointer *)uVar5)->d == 0) {
                      QArrayData::deallocate((QArrayData *)local_68._0_8_,2,0x10);
                    }
                  }
                  uVar5 = local_98._0_8_;
                  if ((ProString *)local_98._0_8_ != (ProString *)0x0) {
                    LOCK();
                    *(int *)&((DataPointer *)local_98._0_8_)->d =
                         *(int *)&((DataPointer *)local_98._0_8_)->d + -1;
                    UNLOCK();
                    if (*(int *)&((DataPointer *)uVar5)->d == 0) {
                      QArrayData::deallocate((QArrayData *)local_98._0_8_,2,0x10);
                    }
                  }
                  local_98[8] = 0x2f;
                  local_98._0_8_ = (ProString *)local_b8;
                  local_98._16_8_ = pQVar18;
                  QStringBuilder<QStringBuilder<QString_&,_char>,_ProString_&>::convertTo<QString>
                            (&local_170,
                             (QStringBuilder<QStringBuilder<QString_&,_char>,_ProString_&> *)
                             local_98);
                  local_68._0_8_ = local_170.d.d;
                  local_68._8_8_ = local_170.d.ptr;
                  local_68._16_8_ = local_170.d.size;
                  if ((ProString *)local_170.d.d != (ProString *)0x0) {
                    LOCK();
                    *(int *)&(((QString *)&(local_170.d.d)->super_QArrayData)->d).d =
                         *(int *)&(((QString *)&(local_170.d.d)->super_QArrayData)->d).d + 1;
                    UNLOCK();
                  }
                  file_00.d.ptr._7_1_ = bVar9;
                  file_00.d._0_15_ = in_stack_fffffffffffffdf8;
                  file_00.d.size._0_4_ = uVar17;
                  file_00.d.size._4_4_ = idx;
                  fileInfo((MakefileGenerator *)local_138,file_00);
                  cVar10 = QFileInfo::exists();
                  QFileInfo::~QFileInfo((QFileInfo *)local_138);
                  if ((ProString *)local_68._0_8_ != (ProString *)0x0) {
                    LOCK();
                    *(int *)&(((QString *)local_68._0_8_)->d).d =
                         *(int *)&(((QString *)local_68._0_8_)->d).d + -1;
                    UNLOCK();
                    if (*(int *)&(((QString *)local_68._0_8_)->d).d == 0) {
                      QArrayData::deallocate((QArrayData *)local_68._0_8_,2,0x10);
                    }
                  }
                  if ((ProString *)local_170.d.d != (ProString *)0x0) {
                    LOCK();
                    *(int *)&(((QString *)&(local_170.d.d)->super_QArrayData)->d).d =
                         *(int *)&(((QString *)&(local_170.d.d)->super_QArrayData)->d).d + -1;
                    UNLOCK();
                    if (*(int *)&(((QString *)&(local_170.d.d)->super_QArrayData)->d).d == 0) {
                      QArrayData::deallocate(&(local_170.d.d)->super_QArrayData,2,0x10);
                    }
                  }
                  if (cVar10 != '\0') {
                    local_48 = &DAT_aaaaaaaaaaaaaaaa;
                    puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
                    local_68._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
                    local_68._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
                    local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
                    local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
                    ProString::ProString((ProString *)local_68,this_01.i);
                    bVar12 = ProString::endsWith((ProString *)local_68,&Option::dir_sep,
                                                 CaseSensitive);
                    if (!bVar12) {
                      ProString::append((ProString *)local_68,&Option::dir_sep);
                    }
                    local_98._0_8_ = (ProString *)local_68;
                    local_98._8_8_ = pQVar18;
                    ProString::operator=
                              ((ProString *)pQVar18,
                               (QStringBuilder<ProString_&,_ProString_&> *)local_98);
                    if ((uVar17 & 4) == 0) {
                      ProString::toQString((QString *)local_158,(ProString *)pQVar18);
                      fileFixify((QString *)local_138,this,(QString *)local_158,(FileFixifyTypes)0x0
                                 ,true);
                      ProString::ProString((ProString *)local_98,(QString *)local_138);
                      QString::operator=((QString *)pQVar18,(QString *)local_98);
                      uVar5 = local_98._0_8_;
                      (pQVar18->super_QMakeEvaluator).m_locationStack.
                      super_QList<QMakeEvaluator::Location>.d.ptr = (Location *)local_70.d;
                      *(undefined8 *)&(pQVar18->super_QMakeEvaluator).m_current.line =
                           local_98._24_8_;
                      (pQVar18->super_QMakeEvaluator).m_locationStack.
                      super_QList<QMakeEvaluator::Location>.d.d = (Data *)QStack_78.d;
                      if ((ProString *)local_98._0_8_ != (ProString *)0x0) {
                        LOCK();
                        *(int *)&((DataPointer *)local_98._0_8_)->d =
                             *(int *)&((DataPointer *)local_98._0_8_)->d + -1;
                        UNLOCK();
                        if (*(int *)&((DataPointer *)uVar5)->d == 0) {
                          QArrayData::deallocate((QArrayData *)local_98._0_8_,2,0x10);
                        }
                      }
                      if ((ProString *)local_138._0_8_ != (ProString *)0x0) {
                        LOCK();
                        *(int *)&(((QString *)local_138._0_8_)->d).d =
                             *(int *)&(((QString *)local_138._0_8_)->d).d + -1;
                        UNLOCK();
                        if (*(int *)&(((QString *)local_138._0_8_)->d).d == 0) {
                          QArrayData::deallocate((QArrayData *)local_138._0_8_,2,0x10);
                        }
                      }
                      if ((ProString *)local_158._0_8_ != (ProString *)0x0) {
                        LOCK();
                        *(int *)&(((QString *)local_158._0_8_)->d).d =
                             *(int *)&(((QString *)local_158._0_8_)->d).d + -1;
                        UNLOCK();
                        if (*(int *)&(((QString *)local_158._0_8_)->d).d == 0) {
                          QArrayData::deallocate((QArrayData *)local_158._0_8_,2,0x10);
                        }
                      }
                    }
                    if (Option::debug_level != 0) {
                      QString::toLatin1_helper((QString *)local_98);
                      pQVar22 = (QMakeProject *)local_98._8_8_;
                      if ((QMakeProject *)local_98._8_8_ == (QMakeProject *)0x0) {
                        pQVar22 = (QMakeProject *)&QByteArray::_empty;
                      }
                      ProString::toLatin1((QByteArray *)local_138,(ProString *)pQVar18);
                      debug_msg_internal(1,"Found file through vpath %s -> %s",pQVar22);
                      if ((ProString *)local_138._0_8_ != (ProString *)0x0) {
                        LOCK();
                        *(int *)&(((QString *)local_138._0_8_)->d).d =
                             *(int *)&(((QString *)local_138._0_8_)->d).d + -1;
                        UNLOCK();
                        if (*(int *)&(((QString *)local_138._0_8_)->d).d == 0) {
                          QArrayData::deallocate((QArrayData *)local_138._0_8_,1,0x10);
                        }
                      }
                      if ((ProString *)local_98._0_8_ != (ProString *)0x0) {
                        LOCK();
                        *(int *)&(((QString *)local_98._0_8_)->d).d =
                             *(int *)&(((QString *)local_98._0_8_)->d).d + -1;
                        UNLOCK();
                        if (*(int *)&(((QString *)local_98._0_8_)->d).d == 0) {
                          QArrayData::deallocate((QArrayData *)local_98._0_8_,1,0x10);
                        }
                      }
                    }
                    if ((ProString *)local_68._0_8_ != (ProString *)0x0) {
                      LOCK();
                      *(int *)&(((QString *)local_68._0_8_)->d).d =
                           *(int *)&(((QString *)local_68._0_8_)->d).d + -1;
                      UNLOCK();
                      if (*(int *)&(((QString *)local_68._0_8_)->d).d == 0) {
                        QArrayData::deallocate((QArrayData *)local_68._0_8_,2,0x10);
                      }
                    }
                    bVar12 = true;
                  }
                  if ((ProString *)local_b8._0_8_ != (ProString *)0x0) {
                    LOCK();
                    *(int *)&(((QString *)local_b8._0_8_)->d).d =
                         *(int *)&(((QString *)local_b8._0_8_)->d).d + -1;
                    UNLOCK();
                    if (*(int *)&(((QString *)local_b8._0_8_)->d).d == 0) {
                      QArrayData::deallocate((QArrayData *)local_b8._0_8_,2,0x10);
                    }
                  }
                  uVar21 = (ulong)uVar17;
                  if (cVar10 != '\0') break;
                  this_01.i = this_01.i + 1;
                  iVar14 = QList<ProString>::end((QList<ProString> *)(local_138 + 0x60));
                } while (this_01.i != iVar14.i);
                if (bVar12) {
                  bVar12 = true;
                  bVar11 = 0;
                  goto LAB_0015a619;
                }
              }
            }
            local_98._0_8_ = (ProString *)0x0;
            local_98._8_8_ = (QMakeProject *)0x0;
            local_98._16_8_ = (QMakeProject *)0x0;
            local_b8._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
            local_b8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
            local_b8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
            ProString::toQString((QString *)local_b8,(ProString *)pQVar18);
            local_138._16_8_ = (QMakeProject *)0x0;
            local_138._0_8_ = (ProString *)0x0;
            local_138._8_8_ = (QMakeProject *)0x0;
            lVar15 = QString::lastIndexOf
                               ((QString *)local_b8,0x2e5bf0,(CaseSensitivity)local_b8._16_8_);
            bVar11 = bVar9;
            if (lVar15 != -1) {
              lVar15 = QString::lastIndexOf
                                 ((QString *)local_b8,0x2e5bf0,(CaseSensitivity)local_b8._16_8_);
              if ((QMakeProject *)(lVar15 + 1) < (ulong)local_b8._16_8_) {
                QString::QString((QString *)local_68,(QChar *)local_b8._8_8_,(longlong)(lVar15 + 1))
                ;
                bVar11 = bVar9;
              }
              else {
                local_68._0_8_ = local_b8._0_8_;
                local_68._8_8_ = local_b8._8_8_;
                local_68._16_8_ = local_b8._16_8_;
                bVar11 = bVar9;
                if ((ProString *)local_b8._0_8_ != (ProString *)0x0) {
                  LOCK();
                  *(int *)&(((QString *)local_b8._0_8_)->d).d =
                       *(int *)&(((QString *)local_b8._0_8_)->d).d + 1;
                  UNLOCK();
                }
              }
              uVar8 = local_68._16_8_;
              uVar7 = local_68._0_8_;
              uVar6 = local_98._8_8_;
              uVar5 = local_98._0_8_;
              local_68._0_8_ = local_98._0_8_;
              local_98._0_8_ = uVar7;
              local_98._8_8_ = local_68._8_8_;
              local_68._8_8_ = uVar6;
              local_68._16_8_ = local_98._16_8_;
              local_98._16_8_ = uVar8;
              if ((ProString *)uVar5 != (ProString *)0x0) {
                LOCK();
                *(int *)&(((QString *)uVar5)->d).d = *(int *)&(((QString *)uVar5)->d).d + -1;
                UNLOCK();
                if (*(int *)&(((QString *)uVar5)->d).d == 0) {
                  QArrayData::deallocate((QArrayData *)uVar5,2,0x10);
                }
              }
              QString::operator=((QString *)local_138,(QString *)local_98);
              if ((uVar21 & 4) == 0) {
                fileFixify(&local_188,this,(QString *)local_138,(FileFixifyTypes)0x3,true);
                local_68._16_8_ = local_188.d.size;
                local_68._8_8_ = local_188.d.ptr;
                local_68._0_8_ = local_188.d.d;
                local_188.d.d = (Data *)0x0;
                local_188.d.ptr = (char16_t *)0x0;
                local_188.d.size = 0;
                local_68[0x18] = 0x2f;
                QStringBuilder<QString,_char>::convertTo<QString>
                          ((QString *)local_158,(QStringBuilder<QString,_char> *)local_68);
                uVar8 = local_138._8_8_;
                uVar7 = local_138._0_8_;
                uVar6 = local_158._16_8_;
                uVar5 = local_158._0_8_;
                local_158._0_8_ = local_138._0_8_;
                local_138._0_8_ = uVar5;
                local_138._8_8_ = local_158._8_8_;
                local_158._8_8_ = uVar8;
                local_158._16_8_ = local_138._16_8_;
                local_138._16_8_ = uVar6;
                if ((ProString *)uVar7 != (ProString *)0x0) {
                  LOCK();
                  *(int *)&(((QString *)uVar7)->d).d = *(int *)&(((QString *)uVar7)->d).d + -1;
                  UNLOCK();
                  if (*(int *)&(((QString *)uVar7)->d).d == 0) {
                    QArrayData::deallocate((QArrayData *)uVar7,2,0x10);
                  }
                }
                if ((ProString *)local_68._0_8_ != (ProString *)0x0) {
                  LOCK();
                  *(int *)&(((QString *)local_68._0_8_)->d).d =
                       *(int *)&(((QString *)local_68._0_8_)->d).d + -1;
                  UNLOCK();
                  if (*(int *)&(((QString *)local_68._0_8_)->d).d == 0) {
                    QArrayData::deallocate((QArrayData *)local_68._0_8_,2,0x10);
                  }
                }
                if ((ProString *)local_188.d.d != (ProString *)0x0) {
                  LOCK();
                  *(int *)&(((QString *)&(local_188.d.d)->super_QArrayData)->d).d =
                       *(int *)&(((QString *)&(local_188.d.d)->super_QArrayData)->d).d + -1;
                  UNLOCK();
                  if (*(int *)&(((QString *)&(local_188.d.d)->super_QArrayData)->d).d == 0) {
                    QArrayData::deallocate(&(local_188.d.d)->super_QArrayData,2,0x10);
                  }
                }
              }
              QString::remove((longlong)local_b8,0);
            }
            uVar5 = local_138._0_8_;
            bVar9 = bVar11;
            if ((QMakeProject *)local_138._16_8_ == (QMakeProject *)0x0) {
LAB_00159f93:
              local_158._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
              local_158._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
              local_158._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
              QDir::QDir((QDir *)&local_188,(QString *)local_138);
              local_68._0_8_ = (ProString *)0x0;
              local_68._8_8_ = (QMakeProject *)0x0;
              local_68._16_8_ = (QMakeProject *)0x0;
              QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                        ((QMovableArrayOps<QString> *)local_68,0,(QString *)local_b8);
              QList<QString>::end((QList<QString> *)local_68);
              QDir::entryList(local_158,(QDir *)&local_188,(ProString *)local_68,0x6007,0xffffffff);
              QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)local_68)
              ;
              QDir::~QDir((QDir *)&local_188);
              if ((QMakeProject *)local_158._16_8_ == (QMakeProject *)0x0) {
                bVar11 = bVar9;
                if (Option::debug_level != 0) {
                  ProString::toLatin1((QByteArray *)&local_188,(ProString *)pQVar18);
                  pQVar22 = (QMakeProject *)local_188.d.ptr;
                  if ((QMakeProject *)local_188.d.ptr == (QMakeProject *)0x0) {
                    pQVar22 = (QMakeProject *)&QByteArray::_empty;
                  }
                  QVar26.m_data = (storage_type *)0x2;
                  QVar26.m_size = (qsizetype)local_68;
                  QString::fromUtf8(QVar26);
                  local_1b8.d.d = (Data *)local_68._0_8_;
                  local_1b8.d.ptr = (char16_t *)local_68._8_8_;
                  local_1b8.d.size = local_68._16_8_;
                  ProStringList::join(&local_1a0,(ProStringList *)(local_138 + 0x60),&local_1b8);
                  QString::toLatin1_helper_inplace((QString *)local_68);
                  pQVar19 = (QMakeProject *)local_68._8_8_;
                  if ((QMakeProject *)local_68._8_8_ == (QMakeProject *)0x0) {
                    pQVar19 = (QMakeProject *)&QByteArray::_empty;
                  }
                  debug_msg_internal(1,"makefile.cpp:%d Failure to find %s in vpath (%s)",0x12a,
                                     pQVar22,pQVar19);
                  bVar11 = bVar9;
                  if ((ProString *)local_68._0_8_ != (ProString *)0x0) {
                    LOCK();
                    *(int *)&(((QString *)local_68._0_8_)->d).d =
                         *(int *)&(((QString *)local_68._0_8_)->d).d + -1;
                    UNLOCK();
                    if (*(int *)&(((QString *)local_68._0_8_)->d).d == 0) {
                      QArrayData::deallocate((QArrayData *)local_68._0_8_,1,0x10);
                      bVar11 = bVar9;
                    }
                  }
                  if (&(local_1a0.d.d)->super_QArrayData != (QArrayData *)0x0) {
                    LOCK();
                    ((local_1a0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                         = ((local_1a0.d.d)->super_QArrayData).ref_._q_value.
                           super___atomic_base<int>._M_i + -1;
                    UNLOCK();
                    if (((local_1a0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                        _M_i == 0) {
                      QArrayData::deallocate(&(local_1a0.d.d)->super_QArrayData,2,0x10);
                    }
                  }
                  uVar21 = (ulong)uVar17;
                  if ((ProString *)local_1b8.d.d != (ProString *)0x0) {
                    LOCK();
                    *(int *)&(((QString *)&(local_1b8.d.d)->super_QArrayData)->d).d =
                         *(int *)&(((QString *)&(local_1b8.d.d)->super_QArrayData)->d).d + -1;
                    UNLOCK();
                    if (*(int *)&(((QString *)&(local_1b8.d.d)->super_QArrayData)->d).d == 0) {
                      QArrayData::deallocate(&(local_1b8.d.d)->super_QArrayData,2,0x10);
                    }
                  }
                  if ((ProString *)local_188.d.d != (ProString *)0x0) {
                    LOCK();
                    *(int *)&(((QString *)&(local_188.d.d)->super_QArrayData)->d).d =
                         *(int *)&(((QString *)&(local_188.d.d)->super_QArrayData)->d).d + -1;
                    UNLOCK();
                    if (*(int *)&(((QString *)&(local_188.d.d)->super_QArrayData)->d).d == 0) {
                      QArrayData::deallocate(&(local_188.d.d)->super_QArrayData,1,0x10);
                    }
                  }
                }
                bVar9 = bVar11;
                if ((uVar21 & 1) != 0) {
                  ProString::toLatin1((QByteArray *)local_68,(ProString *)pQVar18);
                  pQVar18 = (QMakeProject *)local_68._8_8_;
                  if ((QMakeProject *)local_68._8_8_ == (QMakeProject *)0x0) {
                    pQVar18 = (QMakeProject *)&QByteArray::_empty;
                  }
                  warn_msg(WarnLogic,"Failure to find: %s",pQVar18);
                  bVar9 = bVar11;
                  if ((ProString *)local_68._0_8_ != (ProString *)0x0) {
                    LOCK();
                    *(int *)&(((QString *)local_68._0_8_)->d).d =
                         *(int *)&(((QString *)local_68._0_8_)->d).d + -1;
                    UNLOCK();
                    if (*(int *)&(((QString *)local_68._0_8_)->d).d == 0) {
                      QArrayData::deallocate((QArrayData *)local_68._0_8_,1,0x10);
                      bVar9 = bVar11;
                    }
                  }
                }
              }
              else {
                ProStringList::removeAt((ProStringList *)this_02,idx);
                local_188.d.d = (Data *)0x0;
                local_188.d.ptr = (char16_t *)0x0;
                local_188.d.size = 0;
                if (0 < (int)(uint)local_158._16_8_) {
                  uVar23 = (ulong)((uint)local_158._16_8_ & 0x7fffffff);
                  uVar24 = uVar23 + 1;
                  lVar15 = uVar23 * 0x18;
                  do {
                    pQVar16 = QList<QString>::data((QList<QString> *)local_158);
                    local_1a0.d.ptr = (char16_t *)((long)&pQVar16[-1].d.d + lVar15);
                    local_1a0.d.d = (Data *)local_138;
                    QStringBuilder<QString_&,_QString_&>::convertTo<QString>
                              ((QString *)local_68,
                               (QStringBuilder<QString_&,_QString_&> *)&local_1a0);
                    uVar6 = local_68._16_8_;
                    uVar5 = local_68._0_8_;
                    pcVar4 = local_188.d.ptr;
                    pDVar3 = local_188.d.d;
                    local_68._0_8_ = local_188.d.d;
                    local_188.d.d = (Data *)uVar5;
                    local_188.d.ptr = (char16_t *)local_68._8_8_;
                    local_68._8_8_ = pcVar4;
                    local_68._16_8_ = local_188.d.size;
                    local_188.d.size = uVar6;
                    if ((ProString *)pDVar3 != (ProString *)0x0) {
                      LOCK();
                      *(int *)&(((QString *)&pDVar3->super_QArrayData)->d).d =
                           *(int *)&(((QString *)&pDVar3->super_QArrayData)->d).d + -1;
                      UNLOCK();
                      if (*(int *)&(((QString *)&pDVar3->super_QArrayData)->d).d == 0) {
                        QArrayData::deallocate(&pDVar3->super_QArrayData,2,0x10);
                      }
                    }
                    if ((uVar21 & 4) == 0) {
                      fileFixify((QString *)local_68,this,&local_188,(FileFixifyTypes)0x0,true);
                      uVar6 = local_68._16_8_;
                      uVar5 = local_68._0_8_;
                      pcVar4 = local_188.d.ptr;
                      pDVar3 = local_188.d.d;
                      local_68._0_8_ = local_188.d.d;
                      local_188.d.d = (Data *)uVar5;
                      local_188.d.ptr = (char16_t *)local_68._8_8_;
                      local_68._8_8_ = pcVar4;
                      local_68._16_8_ = local_188.d.size;
                      local_188.d.size = uVar6;
                      if ((ProString *)pDVar3 != (ProString *)0x0) {
                        LOCK();
                        *(int *)&(((QString *)&pDVar3->super_QArrayData)->d).d =
                             *(int *)&(((QString *)&pDVar3->super_QArrayData)->d).d + -1;
                        UNLOCK();
                        if (*(int *)&(((QString *)&pDVar3->super_QArrayData)->d).d == 0) {
                          QArrayData::deallocate(&pDVar3->super_QArrayData,2,0x10);
                        }
                      }
                    }
                    ProString::ProString((ProString *)local_68,&local_188);
                    QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>
                              ((QMovableArrayOps<ProString> *)this_02,i,(ProString *)local_68);
                    QList<ProString>::begin(this_02);
                    if ((ProString *)local_68._0_8_ != (ProString *)0x0) {
                      LOCK();
                      *(int *)&(((QString *)local_68._0_8_)->d).d =
                           *(int *)&(((QString *)local_68._0_8_)->d).d + -1;
                      UNLOCK();
                      if (*(int *)&(((QString *)local_68._0_8_)->d).d == 0) {
                        QArrayData::deallocate((QArrayData *)local_68._0_8_,2,0x10);
                      }
                    }
                    uVar24 = uVar24 - 1;
                    lVar15 = lVar15 + -0x18;
                  } while (1 < uVar24);
                  if ((ProString *)local_188.d.d != (ProString *)0x0) {
                    LOCK();
                    *(int *)&(((QString *)&(local_188.d.d)->super_QArrayData)->d).d =
                         *(int *)&(((QString *)&(local_188.d.d)->super_QArrayData)->d).d + -1;
                    UNLOCK();
                    if (*(int *)&(((QString *)&(local_188.d.d)->super_QArrayData)->d).d == 0) {
                      QArrayData::deallocate(&(local_188.d.d)->super_QArrayData,2,0x10);
                    }
                  }
                }
                bVar11 = 0;
              }
              QArrayDataPointer<QString>::~QArrayDataPointer
                        ((QArrayDataPointer<QString> *)local_158);
            }
            else {
              if ((ProString *)local_138._0_8_ == (ProString *)0x0) {
                local_68._0_8_ = (ProString *)0x0;
              }
              else {
                LOCK();
                *(int *)&(((QString *)local_138._0_8_)->d).d =
                     *(int *)&(((QString *)local_138._0_8_)->d).d + 1;
                UNLOCK();
                local_68._0_8_ = local_138._0_8_;
                LOCK();
                *(int *)&(((QString *)local_138._0_8_)->d).d =
                     *(int *)&(((QString *)local_138._0_8_)->d).d + 1;
                UNLOCK();
              }
              local_68._16_8_ = local_138._16_8_;
              local_68._8_8_ = local_138._8_8_;
              file_01.d.ptr._7_1_ = bVar11;
              file_01.d._0_15_ = in_stack_fffffffffffffdf8;
              file_01.d.size._0_4_ = uVar17;
              file_01.d.size._4_4_ = idx;
              fileInfo((MakefileGenerator *)local_158,file_01);
              cVar10 = QFileInfo::exists();
              QFileInfo::~QFileInfo((QFileInfo *)local_158);
              if ((ProString *)local_68._0_8_ != (ProString *)0x0) {
                LOCK();
                *(int *)&(((QString *)local_68._0_8_)->d).d =
                     *(int *)&(((QString *)local_68._0_8_)->d).d + -1;
                UNLOCK();
                if (*(int *)&(((QString *)local_68._0_8_)->d).d == 0) {
                  QArrayData::deallocate((QArrayData *)local_68._0_8_,2,0x10);
                }
              }
              if ((ProString *)uVar5 != (ProString *)0x0) {
                LOCK();
                *(int *)&(((QString *)uVar5)->d).d = *(int *)&(((QString *)uVar5)->d).d + -1;
                UNLOCK();
                if (*(int *)&(((QString *)uVar5)->d).d == 0) {
                  QArrayData::deallocate((QArrayData *)uVar5,2,0x10);
                }
              }
              uVar21 = (ulong)uVar17;
              bVar9 = bVar11;
              if (cVar10 != '\0') goto LAB_00159f93;
              if (Option::debug_level != 0) {
                QString::toLatin1_helper((QString *)local_68);
                pQVar22 = (QMakeProject *)local_68._8_8_;
                if ((QMakeProject *)local_68._8_8_ == (QMakeProject *)0x0) {
                  pQVar22 = (QMakeProject *)&QByteArray::_empty;
                }
                QString::toLatin1_helper((QString *)local_158);
                pQVar19 = (QMakeProject *)local_158._8_8_;
                if ((QMakeProject *)local_158._8_8_ == (QMakeProject *)0x0) {
                  pQVar19 = (QMakeProject *)&QByteArray::_empty;
                }
                QString::toLatin1_helper((QString *)&local_188);
                pQVar20 = (QMakeProject *)local_188.d.ptr;
                if ((QMakeProject *)local_188.d.ptr == (QMakeProject *)0x0) {
                  pQVar20 = (QMakeProject *)&QByteArray::_empty;
                }
                debug_msg_internal(1,"makefile.cpp:%d Cannot match %s%s, as %s does not exist.",
                                   0x13c,pQVar22,pQVar19,pQVar20);
                if ((ProString *)local_188.d.d != (ProString *)0x0) {
                  LOCK();
                  *(int *)&(((QString *)&(local_188.d.d)->super_QArrayData)->d).d =
                       *(int *)&(((QString *)&(local_188.d.d)->super_QArrayData)->d).d + -1;
                  UNLOCK();
                  if (*(int *)&(((QString *)&(local_188.d.d)->super_QArrayData)->d).d == 0) {
                    QArrayData::deallocate(&(local_188.d.d)->super_QArrayData,1,0x10);
                  }
                }
                if ((ProString *)local_158._0_8_ != (ProString *)0x0) {
                  LOCK();
                  *(int *)&(((QString *)local_158._0_8_)->d).d =
                       *(int *)&(((QString *)local_158._0_8_)->d).d + -1;
                  UNLOCK();
                  if (*(int *)&(((QString *)local_158._0_8_)->d).d == 0) {
                    QArrayData::deallocate((QArrayData *)local_158._0_8_,1,0x10);
                  }
                }
                uVar21 = (ulong)uVar17;
                if ((ProString *)local_68._0_8_ != (ProString *)0x0) {
                  LOCK();
                  *(int *)&(((QString *)local_68._0_8_)->d).d =
                       *(int *)&(((QString *)local_68._0_8_)->d).d + -1;
                  UNLOCK();
                  if (*(int *)&(((QString *)local_68._0_8_)->d).d == 0) {
                    QArrayData::deallocate((QArrayData *)local_68._0_8_,1,0x10);
                  }
                }
              }
              bVar9 = bVar11;
              if ((uVar21 & 1) != 0) {
                ProString::toLatin1((QByteArray *)local_68,(ProString *)pQVar18);
                pQVar18 = (QMakeProject *)local_68._8_8_;
                if ((QMakeProject *)local_68._8_8_ == (QMakeProject *)0x0) {
                  pQVar18 = (QMakeProject *)&QByteArray::_empty;
                }
                warn_msg(WarnLogic,"Failure to find: %s",pQVar18);
                bVar9 = bVar11;
                if ((ProString *)local_68._0_8_ != (ProString *)0x0) {
                  LOCK();
                  *(int *)&(((QString *)local_68._0_8_)->d).d =
                       *(int *)&(((QString *)local_68._0_8_)->d).d + -1;
                  UNLOCK();
                  if (*(int *)&(((QString *)local_68._0_8_)->d).d == 0) {
                    QArrayData::deallocate((QArrayData *)local_68._0_8_,1,0x10);
                    bVar9 = bVar11;
                  }
                }
              }
            }
            if ((ProString *)local_138._0_8_ != (ProString *)0x0) {
              LOCK();
              *(int *)&(((QString *)local_138._0_8_)->d).d =
                   *(int *)&(((QString *)local_138._0_8_)->d).d + -1;
              UNLOCK();
              if (*(int *)&(((QString *)local_138._0_8_)->d).d == 0) {
                QArrayData::deallocate((QArrayData *)local_138._0_8_,2,0x10);
              }
            }
            if ((ProString *)local_b8._0_8_ != (ProString *)0x0) {
              LOCK();
              *(int *)&(((QString *)local_b8._0_8_)->d).d =
                   *(int *)&(((QString *)local_b8._0_8_)->d).d + -1;
              UNLOCK();
              if (*(int *)&(((QString *)local_b8._0_8_)->d).d == 0) {
                QArrayData::deallocate((QArrayData *)local_b8._0_8_,2,0x10);
              }
            }
            if ((ProString *)local_98._0_8_ != (ProString *)0x0) {
              LOCK();
              *(int *)&(((QString *)local_98._0_8_)->d).d =
                   *(int *)&(((QString *)local_98._0_8_)->d).d + -1;
              UNLOCK();
              if (*(int *)&(((QString *)local_98._0_8_)->d).d == 0) {
                QArrayData::deallocate((QArrayData *)local_98._0_8_,2,0x10);
              }
            }
            bVar12 = true;
          }
          else {
            idx = idx + 1;
            bVar11 = 0;
            bVar12 = false;
            uVar21 = (ulong)uVar17;
          }
        }
LAB_0015a619:
        if ((ProString *)local_138._32_8_ != (ProString *)0x0) {
          LOCK();
          *(int *)&(((QString *)local_138._32_8_)->d).d =
               *(int *)&(((QString *)local_138._32_8_)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)local_138._32_8_)->d).d == 0) {
            QArrayData::deallocate((QArrayData *)local_138._32_8_,2,0x10);
          }
        }
        if ((ProString *)local_f8.d.d != (ProString *)0x0) {
          LOCK();
          *(int *)&(((QString *)&(local_f8.d.d)->super_QArrayData)->d).d =
               *(int *)&(((QString *)&(local_f8.d.d)->super_QArrayData)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)&(local_f8.d.d)->super_QArrayData)->d).d == 0) {
            QArrayData::deallocate(&(local_f8.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (bVar12) {
          if ((bVar11 & 1) == 0) goto LAB_0015a68c;
          ProStringList::removeAt((ProStringList *)this_02,idx);
        }
      }
      i = (qsizetype)idx;
      lVar15 = (this_02->d).size;
    } while (i < lVar15);
  }
  pDVar1 = (this_02->d).d;
  pPVar2 = (this_02->d).ptr;
  (this_02->d).d = (Data *)0x0;
  (this_02->d).ptr = (ProString *)0x0;
  (__return_storage_ptr__->super_QList<ProString>).d.d = pDVar1;
  (__return_storage_ptr__->super_QList<ProString>).d.ptr = pPVar2;
  (this_02->d).size = 0;
  (__return_storage_ptr__->super_QList<ProString>).d.size = lVar15;
  QArrayDataPointer<ProString>::~QArrayDataPointer
            ((QArrayDataPointer<ProString> *)(local_138 + 0x60));
  if (*(Data **)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

ProStringList
MakefileGenerator::findFilesInVPATH(ProStringList l, uchar flags, const QString &vpath_var)
{
    ProStringList vpath;
    const ProValueMap &v = project->variables();
    for(int val_it = 0; val_it < l.size(); ) {
        bool remove_file = false;
        ProString &val = l[val_it];
        if(!val.isEmpty()) {
            QString qval = val.toQString();
            QString file = fixEnvVariables(qval);
            if (file.isEmpty()) {
                ++val_it;
                continue;
            }
            if(!(flags & VPATH_NoFixify))
                file = fileFixify(file, FileFixifyBackwards);

            if(exists(file)) {
                ++val_it;
                continue;
            }
            bool found = false;
            if (QDir::isRelativePath(qval)) {
                if(vpath.isEmpty()) {
                    if(!vpath_var.isEmpty())
                        vpath = v[ProKey(vpath_var)];
                    vpath += v["VPATH"] + v["QMAKE_ABSOLUTE_SOURCE_PATH"];
                    if(Option::output_dir != qmake_getpwd())
                        vpath << Option::output_dir;
                }
                for (ProStringList::Iterator vpath_it = vpath.begin();
                    vpath_it != vpath.end(); ++vpath_it) {
                    QString real_dir = Option::normalizePath((*vpath_it).toQString());
                    if (exists(real_dir + '/' + val)) {
                        ProString dir = (*vpath_it);
                        if(!dir.endsWith(Option::dir_sep))
                            dir += Option::dir_sep;
                        val = dir + val;
                        if(!(flags & VPATH_NoFixify))
                            val = fileFixify(val.toQString());
                        found = true;
                        debug_msg(1, "Found file through vpath %s -> %s",
                                  file.toLatin1().constData(), val.toLatin1().constData());
                        break;
                    }
                }
            }
            if(!found) {
                QString dir, regex = val.toQString(), real_dir;
                if(regex.lastIndexOf(Option::dir_sep) != -1) {
                    dir = regex.left(regex.lastIndexOf(Option::dir_sep) + 1);
                    real_dir = dir;
                    if(!(flags & VPATH_NoFixify))
                        real_dir = fileFixify(real_dir, FileFixifyBackwards) + '/';
                    regex.remove(0, dir.size());
                }
                if(real_dir.isEmpty() || exists(real_dir)) {
                    QStringList files = QDir(real_dir).entryList(QStringList(regex),
                                                QDir::NoDotAndDotDot | QDir::AllEntries);
                    if(files.isEmpty()) {
                        debug_msg(1, "makefile.cpp:%d Failure to find %s in vpath (%s)",
                                  __LINE__, val.toLatin1().constData(),
                                  vpath.join(QString("::")).toLatin1().constData());
                        if (flags & VPATH_RemoveMissingFiles)
                            remove_file = true;
                        if (flags & VPATH_WarnMissingFiles)
                            warn_msg(WarnLogic, "Failure to find: %s", val.toLatin1().constData());
                    } else {
                        l.removeAt(val_it);
                        QString a;
                        for(int i = (int)files.size()-1; i >= 0; i--) {
                            a = real_dir + files[i];
                            if(!(flags & VPATH_NoFixify))
                                a = fileFixify(a);
                            l.insert(val_it, a);
                        }
                    }
                } else {
                    debug_msg(1, "makefile.cpp:%d Cannot match %s%s, as %s does not exist.",
                              __LINE__, real_dir.toLatin1().constData(),
                              regex.toLatin1().constData(), real_dir.toLatin1().constData());
                    if (flags & VPATH_RemoveMissingFiles)
                        remove_file = true;
                    if (flags & VPATH_WarnMissingFiles)
                        warn_msg(WarnLogic, "Failure to find: %s", val.toLatin1().constData());
                }
            }
        }
        if(remove_file)
            l.removeAt(val_it);
        else
            ++val_it;
    }
    return l;
}